

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::FindHoles
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this)

{
  bool bVar1;
  uint uVar2;
  pointer this_00;
  vector<int,_std::allocator<int>_> *this_01;
  reference pvVar3;
  size_type sVar4;
  long in_RDI;
  CornerIndex corner_id;
  int boundary_id;
  VertexIndex boundary_vert_id;
  CornerIndex i;
  int num_corners;
  pointer in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  value_type in_stack_ffffffffffffff6c;
  CornerIndex corner;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  CornerIndex in_stack_ffffffffffffffa0;
  VertexIndex in_stack_ffffffffffffffa4;
  ThisIndexType local_54;
  uint local_50;
  ThisIndexType local_4c;
  uint local_48;
  CornerIndex in_stack_ffffffffffffffbc;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> in_stack_ffffffffffffffc0;
  CornerIndex in_stack_ffffffffffffffc4;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_38;
  value_type local_34;
  uint local_30;
  uint local_2c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_28;
  uint local_24;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_10;
  uint local_c;
  
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1a1245);
  local_c = CornerTable::num_corners((CornerTable *)0x1a124d);
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_10,0);
  while( true ) {
    local_14 = local_c;
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<(&local_10,&local_14);
    if (!bVar1) break;
    this_00 = std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x1a129d);
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1a12b0)
    ;
    local_1c = local_10.value_;
    local_18 = (uint)CornerTable::Face(in_stack_ffffffffffffff58,
                                       (CornerIndex)(uint)in_stack_ffffffffffffff60);
    bVar1 = CornerTable::IsDegenerated(this_00,(FaceIndex)(uint)in_RDI);
    if (!bVar1) {
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x1a12fe);
      local_24 = local_10.value_;
      local_20.value_ =
           (uint)CornerTable::Opposite(in_stack_ffffffffffffff58,(uint)in_stack_ffffffffffffff60);
      bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                        (&local_20,
                         (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                         &kInvalidCornerIndex);
      if (bVar1) {
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x1a134d);
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x1a1360);
        local_30 = local_10.value_;
        local_2c = (uint)CornerTable::Next((CornerTable *)
                                           CONCAT44(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68),
                                           (CornerIndex)(uint)in_stack_ffffffffffffff70);
        local_28.value_ =
             (uint)CornerTable::Vertex((CornerTable *)
                                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                                       ,(uint)in_stack_ffffffffffffff70);
        this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x170);
        uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_28);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(ulong)uVar2);
        if (*pvVar3 == -1) {
          sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT44(in_stack_ffffffffffffffa4.value_,
                                      in_stack_ffffffffffffffa0.value_));
          local_34 = (value_type)sVar4;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_ffffffffffffffc4.value_,in_stack_ffffffffffffffc0.value_),
                     SUB41(in_stack_ffffffffffffffbc.value_ >> 0x18,0));
          local_38.value_ = local_10.value_;
          while( true ) {
            in_stack_ffffffffffffff70 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x170);
            uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_28);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_ffffffffffffff70,(ulong)uVar2);
            if (*pvVar3 != -1) break;
            in_stack_ffffffffffffff60 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x170);
            in_stack_ffffffffffffff6c = local_34;
            uVar2 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_28);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_ffffffffffffff60,(ulong)uVar2);
            *pvVar3 = in_stack_ffffffffffffff6c;
            std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                       0x1a1475);
            in_stack_ffffffffffffffc0.value_ = local_38.value_;
            in_stack_ffffffffffffffc4 =
                 CornerTable::Next((CornerTable *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                   (uint)in_stack_ffffffffffffff70);
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
                      (&local_38,(ThisIndexType *)&stack0xffffffffffffffc4);
            while( true ) {
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x1a14aa);
              local_48 = local_38.value_;
              in_stack_ffffffffffffffbc =
                   CornerTable::Opposite(in_stack_ffffffffffffff58,(uint)in_stack_ffffffffffffff60);
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                                ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                 &stack0xffffffffffffffbc,
                                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                 &kInvalidCornerIndex);
              corner.value_ = (uint)in_stack_ffffffffffffff70;
              if (!bVar1) break;
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x1a14e7);
              local_50 = local_38.value_;
              local_4c.value_ =
                   (uint)CornerTable::Opposite
                                   (in_stack_ffffffffffffff58,(uint)in_stack_ffffffffffffff60);
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_38,&local_4c);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x1a151c);
              local_54.value_ =
                   (uint)CornerTable::Next((CornerTable *)
                                           CONCAT44(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68),
                                           (uint)in_stack_ffffffffffffff70);
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_38,&local_54);
            }
            in_stack_ffffffffffffff58 =
                 std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
                 operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                             *)0x1a1556);
            std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                       0x1a1568);
            in_stack_ffffffffffffffa0 =
                 CornerTable::Next((CornerTable *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                   corner);
            in_stack_ffffffffffffffa4 =
                 CornerTable::Vertex((CornerTable *)
                                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                     corner);
            IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=
                      (&local_28,(ThisIndexType *)&stack0xffffffffffffffa4);
          }
        }
      }
    }
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator++(&local_10);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::FindHoles() {
  // TODO(ostava): Add more error checking for invalid geometry data.
  const int num_corners = corner_table_->num_corners();
  // Go over all corners and detect non-visited open boundaries
  for (CornerIndex i(0); i < num_corners; ++i) {
    if (corner_table_->IsDegenerated(corner_table_->Face(i))) {
      continue;  // Don't process corners assigned to degenerated faces.
    }
    if (corner_table_->Opposite(i) == kInvalidCornerIndex) {
      // No opposite corner means no opposite face, so the opposite edge
      // of the corner is an open boundary.
      // Check whether we have already traversed the boundary.
      VertexIndex boundary_vert_id =
          corner_table_->Vertex(corner_table_->Next(i));
      if (vertex_hole_id_[boundary_vert_id.value()] != -1) {
        // The start vertex of the boundary edge is already assigned to an
        // open boundary. No need to traverse it again.
        continue;
      }
      // Else we found a new open boundary and we are going to traverse along it
      // and mark all visited vertices.
      const int boundary_id = static_cast<int>(visited_holes_.size());
      visited_holes_.push_back(false);

      CornerIndex corner_id = i;
      while (vertex_hole_id_[boundary_vert_id.value()] == -1) {
        // Mark the first vertex on the open boundary.
        vertex_hole_id_[boundary_vert_id.value()] = boundary_id;
        corner_id = corner_table_->Next(corner_id);
        // Look for the next attached open boundary edge.
        while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
          corner_id = corner_table_->Opposite(corner_id);
          corner_id = corner_table_->Next(corner_id);
        }
        // Id of the next vertex in the vertex on the hole.
        boundary_vert_id =
            corner_table_->Vertex(corner_table_->Next(corner_id));
      }
    }
  }
  return true;
}